

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::~VertexArrayObjectTest(VertexArrayObjectTest *this)

{
  VertexArrayObjectTest *this_local;
  
  ~VertexArrayObjectTest(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

VertexArrayObjectTest::~VertexArrayObjectTest (void)
{
}